

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

int forward(int menu)

{
  menuwindow *pmVar1;
  int iVar2;
  Fl_Menu_Item *this;
  int local_34;
  Fl_Menu_Item *m1;
  int item;
  menuwindow *m;
  menustate *pp;
  int menu_local;
  
  pp._0_4_ = menu;
  if (menu == -1) {
    pp._0_4_ = 0;
  }
  pmVar1 = p->p[(int)pp];
  if ((int)pp == p->menu_number) {
    local_34 = p->item_number;
  }
  else {
    local_34 = pmVar1->selected;
  }
  m1._4_4_ = local_34;
  do {
    m1._4_4_ = m1._4_4_ + 1;
    if (pmVar1->numitems <= m1._4_4_) {
      return 0;
    }
    this = Fl_Menu_Item::next(pmVar1->menu,m1._4_4_);
    iVar2 = Fl_Menu_Item::activevisible(this);
  } while (iVar2 == 0);
  setitem(this,(int)pp,m1._4_4_);
  return 1;
}

Assistant:

static int forward(int menu) { // go to next item in menu menu if possible
  menustate &pp = *p;
  // Fl_Menu_Button can generate menu=-1. This line fixes it and selectes the first item.
  if (menu==-1) 
    menu = 0;
  menuwindow &m = *(pp.p[menu]);
  int item = (menu == pp.menu_number) ? pp.item_number : m.selected;
  while (++item < m.numitems) {
    const Fl_Menu_Item* m1 = m.menu->next(item);
    if (m1->activevisible()) {setitem(m1, menu, item); return 1;}
  }
  return 0;
}